

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPNSS.cpp
# Opt level: O1

void __thiscall NaPNStateSpace::NaPNStateSpace(NaPNStateSpace *this,char *szNodeName)

{
  NaPetriNode::NaPetriNode(&this->super_NaPetriNode,szNodeName);
  NaTimer::NaTimer(&this->super_NaTimer);
  (this->super_NaPetriNode)._vptr_NaPetriNode = (_func_int **)&PTR__NaPNStateSpace_001786e8;
  (this->super_NaTimer)._vptr_NaTimer = (_func_int **)&PTR_SetSamplingRate_001787e0;
  NaPetriCnInput::NaPetriCnInput(&this->u,&this->super_NaPetriNode,"u");
  NaPetriCnInput::NaPetriCnInput(&this->time,&this->super_NaPetriNode,"time");
  NaPetriCnOutput::NaPetriCnOutput(&this->y,&this->super_NaPetriNode,"y");
  NaPetriCnOutput::NaPetriCnOutput(&this->x,&this->super_NaPetriNode,"x");
  return;
}

Assistant:

NaPNStateSpace::NaPNStateSpace (const char* szNodeName)
: NaPetriNode(szNodeName),
  ////////////////
  // Connectors //
  ////////////////
  u(this, "u"),
  x(this, "x"),
  y(this, "y"),
  time(this, "time")
{
    // Nothing to do
}